

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void wal_delete_compact_upto_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  ulong uVar6;
  fdb_config *pfVar7;
  long extraout_RDX;
  char *pcVar8;
  fdb_config *fconfig_00;
  uint uVar9;
  ulong uVar10;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar11;
  fdb_iterator *pfVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  long lVar15;
  fdb_kvs_handle *unaff_R13;
  fdb_custom_cmp_variable p_Var16;
  char *pcVar17;
  fdb_doc **doc;
  char *pcVar18;
  fdb_kvs_info *info;
  undefined4 uVar19;
  undefined4 uVar20;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  size_t valuelen;
  void *value;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_kvs_info kvs_info;
  char keybuf [256];
  fdb_config fconfig;
  fdb_file_handle *pfStackY_1280;
  timeval tStackY_1278;
  fdb_config fStackY_1268;
  code *pcStackY_1170;
  fdb_kvs_handle *pfStackY_1168;
  fdb_kvs_handle *pfStackY_1160;
  ulong uStackY_1158;
  fdb_kvs_handle *pfStackY_1150;
  fdb_kvs_config fStackY_1148;
  timeval tStackY_1130;
  char *pcStackY_1120;
  char *pcStackY_1118;
  fdb_kvs_handle *pfStackY_1110;
  char *pcStackY_1108;
  char *pcStackY_1100;
  code *pcStackY_10f8;
  fdb_file_handle *pfStackY_10e8;
  int iStackY_10dc;
  fdb_kvs_handle *pfStackY_10d8;
  fdb_kvs_handle *pfStackY_10d0;
  fdb_kvs_handle *pfStackY_10c8;
  fdb_kvs_handle *pfStackY_10c0;
  fdb_kvs_handle *pfStackY_10b8;
  undefined8 uStackY_10b0;
  undefined8 uStackY_10a8;
  undefined8 uStackY_10a0;
  timeval tStackY_1090;
  fdb_kvs_config fStackY_1080;
  fdb_config fStackY_1068;
  char acStackY_f70 [256];
  char acStackY_e70 [272];
  char *pcStackY_d60;
  fdb_kvs_handle *pfStackY_d58;
  char *pcStackY_d48;
  code *pcStackY_d40;
  fdb_snapshot_info_t *pfStackY_d30;
  fdb_kvs_handle *pfStackY_d28;
  uint64_t uStackY_d20;
  timeval tStackY_d18;
  size_t sStackY_d08;
  fdb_kvs_handle **ppfStackY_d00;
  code *pcStackY_cf8;
  fdb_kvs_handle *pfStackY_cf0;
  fdb_kvs_handle *pfStackY_ce8;
  fdb_kvs_handle *pfStackY_ce0;
  fdb_kvs_handle *pfStackY_cd8;
  undefined8 uStackY_cd0;
  undefined8 uStackY_cc8;
  fdb_kvs_handle *pfStackY_cc0;
  timeval tStackY_cb0;
  fdb_kvs_config fStackY_ca0;
  fdb_config fStackY_c88;
  char acStackY_b90 [256];
  fdb_kvs_handle *apfStackY_a90 [33];
  fdb_config *pfStackY_988;
  fdb_kvs_handle *pfStackY_980;
  fdb_kvs_handle *pfStackY_978;
  char *pcStackY_970;
  fdb_kvs_handle *pfStackY_968;
  btree *pbStackY_960;
  fdb_iterator *pfStack_948;
  int iStack_93c;
  fdb_kvs_handle *pfStack_938;
  fdb_file_handle *pfStack_930;
  fdb_kvs_handle *pfStack_928;
  char *pcStack_920;
  int iStack_918;
  undefined4 uStack_914;
  fdb_snapshot_info_t *pfStack_910;
  fdb_kvs_handle *pfStack_908;
  fdb_kvs_handle *pfStack_900;
  long lStack_8f8;
  fdb_kvs_config fStack_8f0;
  char acStack_8d8 [256];
  timeval tStack_7d8;
  undefined1 auStack_7c8 [48];
  fdb_kvs_handle fStack_798;
  fdb_kvs_handle *pfStack_590;
  fdb_doc **ppfStack_588;
  fdb_kvs_info *pfStack_580;
  btree *pbStack_578;
  fdb_kvs_handle *pfStack_568;
  fdb_kvs_handle *pfStack_560;
  fdb_file_handle *pfStack_558;
  fdb_doc *pfStack_550;
  fdb_iterator *pfStack_548;
  fdb_snapshot_info_t *pfStack_540;
  uint64_t uStack_538;
  fdb_kvs_info fStack_530;
  timeval tStack_500;
  fdb_kvs_config fStack_4f0;
  fdb_config fStack_4d8;
  fdb_doc *apfStack_3e0 [32];
  char *pcStack_2e0;
  fdb_kvs_handle *pfStack_2d8;
  fdb_kvs_handle *pfStack_2d0;
  char *pcStack_2c8;
  fdb_kvs_handle *pfStack_2c0;
  fdb_kvs_handle *local_2b0;
  fdb_file_handle *local_2a8;
  fdb_snapshot_info_t *local_2a0;
  uint64_t local_298;
  undefined1 local_290 [16];
  timeval local_280;
  fdb_kvs_config local_270;
  fdb_kvs_info local_258;
  char local_228 [256];
  fdb_config local_128;
  
  pfStack_2c0 = (fdb_kvs_handle *)0x112400;
  gettimeofday(&local_280,(__timezone_ptr_t)0x0);
  pfStack_2c0 = (fdb_kvs_handle *)0x112405;
  memleak_start();
  pfStack_2c0 = (fdb_kvs_handle *)0x112411;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2c0 = (fdb_kvs_handle *)0x112421;
  fdb_get_default_config();
  pfStack_2c0 = (fdb_kvs_handle *)0x11242e;
  fdb_get_default_kvs_config();
  local_128.wal_threshold = 0x13;
  local_128.flags = 1;
  pfStack_2c0 = (fdb_kvs_handle *)0x112454;
  fdb_open(&local_2a8,"./compact_test5",&local_128);
  pfStack_2c0 = (fdb_kvs_handle *)0x112464;
  fdb_kvs_open_default(local_2a8,&local_2b0,&local_270);
  pcVar8 = "key%d";
  pcVar17 = local_228;
  pcVar18 = "value";
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_2c0 = (fdb_kvs_handle *)0x11248b;
    sprintf(pcVar17,"key%d",pfVar5);
    pfVar13 = local_2b0;
    pfStack_2c0 = (fdb_kvs_handle *)0x112498;
    sVar3 = strlen(pcVar17);
    pfStack_2c0 = (fdb_kvs_handle *)0x1124af;
    fVar1 = fdb_set_kv(pfVar13,pcVar17,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_2c0 = (fdb_kvs_handle *)0x11271c;
      wal_delete_compact_upto_test();
      goto LAB_0011271c;
    }
    uVar9 = (int)pfVar5 + 1;
    pfVar5 = (fdb_kvs_handle *)(ulong)uVar9;
  } while (uVar9 != 10);
  pfStack_2c0 = (fdb_kvs_handle *)0x1124cd;
  fVar1 = fdb_commit(local_2a8,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011272b;
  pcVar8 = (char *)0xa;
  pcVar17 = "key%d";
  pcVar18 = local_228;
  pfVar13 = (fdb_kvs_handle *)0x14cf20;
  do {
    pfStack_2c0 = (fdb_kvs_handle *)0x1124ff;
    sprintf(pcVar18,"key%d",pcVar8);
    unaff_R13 = local_2b0;
    pfStack_2c0 = (fdb_kvs_handle *)0x11250c;
    sVar3 = strlen(pcVar18);
    pfStack_2c0 = (fdb_kvs_handle *)0x112523;
    fVar1 = fdb_set_kv(unaff_R13,pcVar18,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011271c;
    uVar9 = (int)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
  } while (uVar9 != 0x14);
  pcVar8 = (char *)0xf;
  pcVar17 = "key%d";
  pcVar18 = local_228;
  do {
    pfStack_2c0 = (fdb_kvs_handle *)0x112555;
    sprintf(pcVar18,"key%d",pcVar8);
    pfVar13 = local_2b0;
    pfStack_2c0 = (fdb_kvs_handle *)0x112562;
    sVar3 = strlen(pcVar18);
    pfStack_2c0 = (fdb_kvs_handle *)0x112570;
    fVar1 = fdb_del_kv(pfVar13,pcVar18,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112721;
    uVar9 = (int)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
  } while (uVar9 != 0x14);
  pfStack_2c0 = (fdb_kvs_handle *)0x11258b;
  fVar1 = fdb_commit(local_2a8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112730;
  pcVar8 = local_228;
  pfStack_2c0 = (fdb_kvs_handle *)0x1125b1;
  sprintf(pcVar8,"key%d",0x14);
  pcVar17 = (char *)local_2b0;
  pfStack_2c0 = (fdb_kvs_handle *)0x1125be;
  sVar3 = strlen(pcVar8);
  pfStack_2c0 = (fdb_kvs_handle *)0x1125d9;
  fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar17,pcVar8,sVar3,"value",5);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112735;
  pfStack_2c0 = (fdb_kvs_handle *)0x1125ed;
  fVar1 = fdb_commit(local_2a8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011273a;
  pfStack_2c0 = (fdb_kvs_handle *)0x112609;
  fVar1 = fdb_get_all_snap_markers(local_2a8,&local_2a0,&local_298);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011273f;
  pfStack_2c0 = (fdb_kvs_handle *)0x112626;
  fVar1 = fdb_compact_upto(local_2a8,(char *)0x0,local_2a0[1].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112744;
  pfStack_2c0 = (fdb_kvs_handle *)0x11263d;
  fVar1 = fdb_free_snap_markers(local_2a0,local_298);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112749;
  pfStack_2c0 = (fdb_kvs_handle *)0x112654;
  fVar1 = fdb_get_kvs_info(local_2b0,&local_258);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar8 = (char *)0xf;
    pcVar17 = "key%d";
    pcVar18 = local_228;
    pfVar13 = (fdb_kvs_handle *)(local_290 + 8);
    unaff_R13 = (fdb_kvs_handle *)local_290;
    while( true ) {
      pfStack_2c0 = (fdb_kvs_handle *)0x112689;
      sprintf(pcVar18,"key%d",pcVar8);
      pfVar5 = local_2b0;
      pfStack_2c0 = (fdb_kvs_handle *)0x112696;
      sVar3 = strlen(pcVar18);
      pfStack_2c0 = (fdb_kvs_handle *)0x1126aa;
      fVar1 = fdb_get_kv(pfVar5,pcVar18,sVar3,(void **)pfVar13,(size_t *)unaff_R13);
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
      uVar9 = (int)pcVar8 + 1;
      pcVar8 = (char *)(ulong)uVar9;
      if (uVar9 == 0x14) {
        pfStack_2c0 = (fdb_kvs_handle *)0x1126c0;
        fdb_kvs_close(local_2b0);
        pfStack_2c0 = (fdb_kvs_handle *)0x1126ca;
        fdb_close(local_2a8);
        pfStack_2c0 = (fdb_kvs_handle *)0x1126cf;
        fdb_shutdown();
        pfStack_2c0 = (fdb_kvs_handle *)0x1126d4;
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (wal_delete_compact_upto_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pfStack_2c0 = (fdb_kvs_handle *)0x112705;
        fprintf(_stderr,pcVar17,"compact upto with wal deletes test");
        return;
      }
    }
    goto LAB_00112726;
  }
  goto LAB_0011274e;
LAB_00112a8e:
  pbStack_578 = (btree *)0x112a93;
  compact_upto_post_snapshot_test();
LAB_00112a93:
  pbStack_578 = (btree *)0x112a98;
  compact_upto_post_snapshot_test();
LAB_00112a98:
  pbStack_578 = (btree *)0x112a9d;
  compact_upto_post_snapshot_test();
  goto LAB_00112a9d;
LAB_00113134:
  pbStackY_960 = (btree *)0x113139;
  compact_upto_overwrite_test();
LAB_00113139:
  pbStackY_960 = (btree *)0x11313e;
  compact_upto_overwrite_test();
LAB_0011313e:
  pbStackY_960 = (btree *)0x113143;
  compact_upto_overwrite_test();
LAB_00113143:
  pbStackY_960 = (btree *)0x113153;
  compact_upto_overwrite_test();
LAB_00113153:
  pbStackY_960 = (btree *)0x11315e;
  compact_upto_overwrite_test();
LAB_0011315e:
  pbStackY_960 = (btree *)0x113163;
  compact_upto_overwrite_test();
LAB_00113163:
  pbStackY_960 = (btree *)0x113168;
  compact_upto_overwrite_test();
LAB_00113168:
  pbStackY_960 = (btree *)0x11316d;
  compact_upto_overwrite_test();
LAB_0011316d:
  pbStackY_960 = (btree *)0x113172;
  compact_upto_overwrite_test();
LAB_00113172:
  pbStackY_960 = (btree *)0x113177;
  compact_upto_overwrite_test();
LAB_00113177:
  pbStackY_960 = (btree *)0x11317c;
  compact_upto_overwrite_test();
  goto LAB_0011317c;
LAB_0011271c:
  pfStack_2c0 = (fdb_kvs_handle *)0x112721;
  wal_delete_compact_upto_test();
LAB_00112721:
  pfStack_2c0 = (fdb_kvs_handle *)0x112726;
  wal_delete_compact_upto_test();
LAB_00112726:
  pfStack_2c0 = (fdb_kvs_handle *)0x11272b;
  wal_delete_compact_upto_test();
LAB_0011272b:
  pfStack_2c0 = (fdb_kvs_handle *)0x112730;
  wal_delete_compact_upto_test();
LAB_00112730:
  pfStack_2c0 = (fdb_kvs_handle *)0x112735;
  wal_delete_compact_upto_test();
LAB_00112735:
  pfStack_2c0 = (fdb_kvs_handle *)0x11273a;
  wal_delete_compact_upto_test();
LAB_0011273a:
  pfStack_2c0 = (fdb_kvs_handle *)0x11273f;
  wal_delete_compact_upto_test();
LAB_0011273f:
  pfStack_2c0 = (fdb_kvs_handle *)0x112744;
  wal_delete_compact_upto_test();
LAB_00112744:
  pfStack_2c0 = (fdb_kvs_handle *)0x112749;
  wal_delete_compact_upto_test();
LAB_00112749:
  pfStack_2c0 = (fdb_kvs_handle *)0x11274e;
  wal_delete_compact_upto_test();
LAB_0011274e:
  pfStack_2c0 = (fdb_kvs_handle *)compact_upto_post_snapshot_test;
  wal_delete_compact_upto_test();
  pbStack_578 = (btree *)0x112771;
  pcStack_2e0 = pcVar8;
  pfStack_2d8 = pfVar13;
  pfStack_2d0 = (fdb_kvs_handle *)pcVar17;
  pcStack_2c8 = pcVar18;
  pfStack_2c0 = pfVar5;
  gettimeofday(&tStack_500,(__timezone_ptr_t)0x0);
  pbStack_578 = (btree *)0x112776;
  memleak_start();
  pfStack_550 = (fdb_doc *)0x0;
  pbStack_578 = (btree *)0x112787;
  system("rm -rf  compact_test* > errorlog.txt");
  pbStack_578 = (btree *)0x112797;
  fdb_get_default_config();
  pbStack_578 = (btree *)0x1127a7;
  fdb_get_default_kvs_config();
  fStack_4d8.wal_threshold = 0x400;
  fStack_4d8.flags = 1;
  fStack_4d8.block_reusing_threshold = 0;
  pbStack_578 = (btree *)0x1127d4;
  fdb_open(&pfStack_558,"./compact_test1",&fStack_4d8);
  pbStack_578 = (btree *)0x1127e4;
  fdb_kvs_open_default(pfStack_558,&pfStack_560,&fStack_4f0);
  pcVar17 = "key%d";
  doc = apfStack_3e0;
  info = (fdb_kvs_info *)0x14cf20;
  pcVar8 = (char *)0x0;
  do {
    pbStack_578 = (btree *)0x11280b;
    sprintf((char *)doc,"key%d",pcVar8);
    pfVar5 = pfStack_560;
    pbStack_578 = (btree *)0x112818;
    sVar3 = strlen((char *)doc);
    pbStack_578 = (btree *)0x11282f;
    pfVar13 = pfVar5;
    fVar1 = fdb_set_kv(pfVar5,doc,sVar3,"value",5);
    iVar2 = (int)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pbStack_578 = (btree *)0x112a8e;
      compact_upto_post_snapshot_test();
      goto LAB_00112a8e;
    }
    pbStack_578 = (btree *)0x112846;
    fdb_commit(pfStack_558,'\x01');
    uVar9 = (int)pcVar8 + 1;
    pcVar8 = (char *)(ulong)uVar9;
  } while (uVar9 != 10);
  pbStack_578 = (btree *)0x11285c;
  pfVar13 = pfStack_560;
  fVar1 = fdb_get_kvs_info(pfStack_560,&fStack_530);
  iVar2 = (int)pfVar13;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar17 = (char *)&fStack_530.last_seqnum;
    if (fStack_530.last_seqnum != 10) {
      pbStack_578 = (btree *)0x112877;
      compact_upto_post_snapshot_test();
    }
    pbStack_578 = (btree *)0x11288b;
    pfVar13 = pfStack_560;
    fVar1 = fdb_snapshot_open(pfStack_560,&pfStack_568,5);
    iVar2 = (int)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa2;
    pbStack_578 = (btree *)0x1128a2;
    pfVar13 = pfStack_568;
    fVar1 = fdb_get_kvs_info(pfStack_568,&fStack_530);
    iVar2 = (int)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aa7;
    if (fStack_530.last_seqnum != 5) {
      pbStack_578 = (btree *)0x1128ba;
      compact_upto_post_snapshot_test();
    }
    pbStack_578 = (btree *)0x1128ce;
    pfVar11 = pfStack_558;
    fVar1 = fdb_get_all_snap_markers(pfStack_558,&pfStack_540,&uStack_538);
    iVar2 = (int)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112aac;
    pbStack_578 = (btree *)0x1128eb;
    pfVar11 = pfStack_558;
    fVar1 = fdb_compact_upto(pfStack_558,(char *)0x0,pfStack_540[5].marker);
    iVar2 = (int)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab1;
    pbStack_578 = (btree *)0x112902;
    fVar1 = fdb_free_snap_markers(pfStack_540,uStack_538);
    iVar2 = (int)pfStack_540;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ab6;
    pbStack_578 = (btree *)0x112919;
    pfVar13 = pfStack_560;
    fVar1 = fdb_get_kvs_info(pfStack_560,&fStack_530);
    iVar2 = (int)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112abb;
    if (fStack_530.last_seqnum != 10) {
      pbStack_578 = (btree *)0x112931;
      compact_upto_post_snapshot_test();
    }
    pbStack_578 = (btree *)0x112940;
    pfVar13 = pfStack_568;
    fVar1 = fdb_get_kvs_info(pfStack_568,&fStack_530);
    iVar2 = (int)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac0;
    if (fStack_530.last_seqnum != 5) {
      pbStack_578 = (btree *)0x112958;
      compact_upto_post_snapshot_test();
    }
    pbStack_578 = (btree *)0x112978;
    pfVar13 = pfStack_568;
    fVar1 = fdb_iterator_init(pfStack_568,&pfStack_548,(void *)0x0,0,(void *)0x0,0,0);
    iVar2 = (int)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112ac5;
    pcVar8 = (char *)0x5;
    doc = &pfStack_550;
    info = &fStack_530;
    do {
      pbStack_578 = (btree *)0x11299c;
      pfVar12 = pfStack_548;
      fVar1 = fdb_iterator_get(pfStack_548,doc);
      iVar2 = (int)pfVar12;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a8e;
      pbStack_578 = (btree *)0x1129ae;
      fdb_doc_free(pfStack_550);
      pfStack_550 = (fdb_doc *)0x0;
      pbStack_578 = (btree *)0x1129c4;
      pfVar13 = pfStack_560;
      fVar1 = fdb_get_kvs_info(pfStack_560,info);
      iVar2 = (int)pfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a93;
      if (fStack_530.last_seqnum != 10) {
        pbStack_578 = (btree *)0x112a0c;
        compact_upto_post_snapshot_test();
      }
      pbStack_578 = (btree *)0x1129e1;
      pfVar13 = pfStack_568;
      fVar1 = fdb_get_kvs_info(pfStack_568,info);
      iVar2 = (int)pfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112a98;
      if (fStack_530.last_seqnum != 5) {
        pbStack_578 = (btree *)0x112a16;
        compact_upto_post_snapshot_test();
      }
      pbStack_578 = (btree *)0x1129fb;
      pfVar12 = pfStack_548;
      fVar1 = fdb_iterator_next(pfStack_548);
      iVar2 = (int)pfVar12;
      uVar9 = (int)pcVar8 - 1;
      pcVar8 = (char *)(ulong)uVar9;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar9 == 0) {
      pbStack_578 = (btree *)0x112a2a;
      fdb_iterator_close(pfStack_548);
      pbStack_578 = (btree *)0x112a34;
      fdb_kvs_close(pfStack_568);
      pbStack_578 = (btree *)0x112a3e;
      fdb_close(pfStack_558);
      pbStack_578 = (btree *)0x112a43;
      fdb_shutdown();
      pbStack_578 = (btree *)0x112a48;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pbStack_578 = (btree *)0x112a79;
      fprintf(_stderr,pcVar17,"compact upto post snapshot test");
      return;
    }
  }
  else {
LAB_00112a9d:
    pbStack_578 = (btree *)0x112aa2;
    compact_upto_post_snapshot_test();
LAB_00112aa2:
    pbStack_578 = (btree *)0x112aa7;
    compact_upto_post_snapshot_test();
LAB_00112aa7:
    pbStack_578 = (btree *)0x112aac;
    compact_upto_post_snapshot_test();
LAB_00112aac:
    pbStack_578 = (btree *)0x112ab1;
    compact_upto_post_snapshot_test();
LAB_00112ab1:
    pbStack_578 = (btree *)0x112ab6;
    compact_upto_post_snapshot_test();
LAB_00112ab6:
    pbStack_578 = (btree *)0x112abb;
    compact_upto_post_snapshot_test();
LAB_00112abb:
    pbStack_578 = (btree *)0x112ac0;
    compact_upto_post_snapshot_test();
LAB_00112ac0:
    pbStack_578 = (btree *)0x112ac5;
    compact_upto_post_snapshot_test();
LAB_00112ac5:
    pbStack_578 = (btree *)0x112aca;
    compact_upto_post_snapshot_test();
  }
  pbStack_578 = (btree *)compact_upto_overwrite_test;
  compact_upto_post_snapshot_test();
  fStack_798.bub_ctx.handle = pfVar5;
  pfVar13 = (fdb_kvs_handle *)0x0;
  pbStackY_960 = (btree *)0x112af6;
  iStack_93c = iVar2;
  fStack_798.bub_ctx.space_used = (uint64_t)pcVar17;
  pfStack_590 = unaff_R13;
  ppfStack_588 = doc;
  pfStack_580 = info;
  pbStack_578 = (btree *)pcVar8;
  gettimeofday(&tStack_7d8,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_8d8,"rm -rf  compact_test* > errorlog.txt",0x25);
  pbStackY_960 = (btree *)0x112b26;
  system(acStack_8d8);
  pbStackY_960 = (btree *)0x112b2b;
  memleak_start();
  pbStackY_960 = (btree *)0x112b35;
  pcVar17 = (char *)malloc(0x20);
  fconfig_00 = (fdb_config *)(auStack_7c8 + 0x130);
  pbStackY_960 = (btree *)0x112b48;
  fdb_get_default_config();
  fStack_798.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_798.config.encryption_key.bytes[0x1d] = '\x02';
  fStack_798.config.encryption_key.bytes[0x14] = 1;
  fStack_798.config.num_keeping_headers._0_1_ = 1;
  fStack_798.config.encryption_key.bytes[4] = '\0';
  fStack_798.config.encryption_key.bytes[5] = '\0';
  fStack_798.config.encryption_key.bytes[6] = '\0';
  fStack_798.config.encryption_key.bytes[7] = '\0';
  fStack_798.config.encryption_key.bytes[8] = '\0';
  fStack_798.config.encryption_key.bytes[9] = '\0';
  fStack_798.config.encryption_key.bytes[10] = '\0';
  fStack_798.config.encryption_key.bytes[0xb] = '\0';
  fStack_798.max_seqnum = 0;
  pbStackY_960 = (btree *)0x112b6b;
  fdb_get_default_kvs_config();
  pbStackY_960 = (btree *)0x112b7f;
  fVar1 = fdb_open(&pfStack_930,"./compact_test",fconfig_00);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011317c:
    pbStackY_960 = (btree *)0x113181;
    compact_upto_overwrite_test();
LAB_00113181:
    pbStackY_960 = (btree *)0x113186;
    compact_upto_overwrite_test();
LAB_00113186:
    pbStackY_960 = (btree *)0x11318b;
    compact_upto_overwrite_test();
LAB_0011318b:
    pbStackY_960 = (btree *)0x113190;
    compact_upto_overwrite_test();
LAB_00113190:
    pbStackY_960 = (btree *)0x113195;
    compact_upto_overwrite_test();
LAB_00113195:
    pbStackY_960 = (btree *)0x11319a;
    compact_upto_overwrite_test();
LAB_0011319a:
    pbStackY_960 = (btree *)0x11319f;
    compact_upto_overwrite_test();
LAB_0011319f:
    pbStackY_960 = (btree *)0x1131a4;
    compact_upto_overwrite_test();
LAB_001131a4:
    pbStackY_960 = (btree *)0x1131a9;
    compact_upto_overwrite_test();
LAB_001131a9:
    pbStackY_960 = (btree *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_cf8 = (code *)0x1131cb;
    pfStackY_988 = fconfig_00;
    pfStackY_980 = pfVar5;
    pfStackY_978 = unaff_R13;
    pcStackY_970 = pcVar17;
    pfStackY_968 = pfVar13;
    pbStackY_960 = (btree *)pcVar8;
    gettimeofday(&tStackY_cb0,(__timezone_ptr_t)0x0);
    pcStackY_cf8 = (code *)0x1131d0;
    memleak_start();
    pcStackY_cf8 = (code *)0x1131dd;
    fdb_get_default_config();
    pcStackY_cf8 = (code *)0x1131ea;
    fdb_get_default_kvs_config();
    fStackY_c88.compaction_cb_ctx = &uStackY_cd0;
    uStackY_cd0 = 0;
    uStackY_cc8 = 0;
    pfStackY_cc0 = (fdb_kvs_handle *)0x0;
    fStackY_c88.wal_threshold = 0x400;
    fStackY_c88.flags = 1;
    fStackY_c88.compaction_cb = compaction_cb_get;
    fStackY_c88.compaction_cb_mask = 0x1b;
    pcStackY_cf8 = (code *)0x113230;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_cf8 = (code *)0x113245;
    fdb_open((fdb_file_handle **)&pfStackY_cf0,"./compact_test1",&fStackY_c88);
    pcStackY_cf8 = (code *)0x11325f;
    fdb_kvs_open((fdb_file_handle *)pfStackY_cf0,&pfStackY_cd8,"db",&fStackY_ca0);
    pcStackY_cf8 = (code *)0x113272;
    fdb_kvs_open((fdb_file_handle *)pfStackY_cf0,&pfStackY_ce8,"db",&fStackY_ca0);
    uVar6 = 0;
    do {
      pcStackY_cf8 = (code *)0x11329e;
      sprintf((char *)apfStackY_a90,"key%04d",uVar6);
      pcStackY_cf8 = (code *)0x1132ad;
      sprintf(acStackY_b90,"body%04d",uVar6);
      pfVar5 = pfStackY_cd8;
      pcStackY_cf8 = (code *)0x1132ba;
      sVar3 = strlen((char *)apfStackY_a90);
      pcStackY_cf8 = (code *)0x1132c5;
      sVar4 = strlen(acStackY_b90);
      pcStackY_cf8 = (code *)0x1132d9;
      ptr_handle = apfStackY_a90;
      pfVar13 = pfVar5;
      fVar1 = fdb_set_kv(pfVar5,apfStackY_a90,sVar3,acStackY_b90,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_cf8 = (code *)0x11339e;
        compact_with_snapshot_open_test();
        goto LAB_0011339e;
      }
      uVar9 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar9;
    } while (uVar9 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_cf8 = (code *)0x1132f9;
    pfVar13 = pfStackY_cf0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_cf0,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_cc0 = pfStackY_ce8;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_cf8 = (code *)0x113316;
      pfVar13 = pfStackY_cf0;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_cf0,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a3;
      ptr_handle = &pfStackY_ce0;
      pcStackY_cf8 = (code *)0x113332;
      pfVar13 = pfStackY_ce8;
      fVar1 = fdb_snapshot_open(pfStackY_ce8,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a8;
      pcStackY_cf8 = (code *)0x113340;
      fdb_kvs_close(pfStackY_ce0);
      pcStackY_cf8 = (code *)0x113349;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_cf0);
      pfVar13 = pfStackY_cf0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133ad;
      pcStackY_cf8 = (code *)0x113352;
      fVar1 = fdb_shutdown();
      pfVar13 = pfStackY_cf0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar17 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pcStackY_cf8 = (code *)0x113387;
        fprintf(_stderr,pcVar17,"compact with snapshot_open test");
        return;
      }
    }
    else {
LAB_0011339e:
      pcStackY_cf8 = (code *)0x1133a3;
      compact_with_snapshot_open_test();
LAB_001133a3:
      pcStackY_cf8 = (code *)0x1133a8;
      compact_with_snapshot_open_test();
LAB_001133a8:
      pcStackY_cf8 = (code *)0x1133ad;
      compact_with_snapshot_open_test();
LAB_001133ad:
      pcStackY_cf8 = (code *)0x1133b2;
      compact_with_snapshot_open_test();
    }
    pcStackY_cf8 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_d40 = (code *)0x1133d3;
    sStackY_d08 = sVar3;
    ppfStackY_d00 = apfStackY_a90;
    pcStackY_cf8 = (code *)uVar6;
    gettimeofday(&tStackY_d18,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX == 0) {
        pcStackY_d40 = (code *)0x1133e2;
        compaction_cb_get();
        goto LAB_001133e2;
      }
    }
    else {
LAB_001133e2:
      if (extraout_RDX != 0) goto LAB_00113449;
    }
    pcStackY_d40 = (code *)0x1133f9;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar13,&pfStackY_d30,&uStackY_d20);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_d40 = (code *)0x11341d;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_ce8->kvs_config).custom_cmp_param,
                                &pfStackY_d28,pfStackY_d30->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011343f;
      pcStackY_d40 = (code *)0x11342b;
      fVar1 = fdb_kvs_close(pfStackY_d28);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return;
      }
    }
    else {
      pcStackY_d40 = (code *)0x11343f;
      compaction_cb_get();
LAB_0011343f:
      pcStackY_d40 = (code *)0x113444;
      compaction_cb_get();
    }
    pcStackY_d40 = (code *)0x113449;
    compaction_cb_get();
LAB_00113449:
    pcStackY_d40 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_d48 = "body%04d";
    pfStackY_d58 = pfVar5;
    pcStackY_10f8 = (code *)0x11346b;
    pcStackY_d60 = acStackY_b90;
    pcStackY_d40 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_1090,(__timezone_ptr_t)0x0);
    pcStackY_10f8 = (code *)0x113470;
    memleak_start();
    pcStackY_10f8 = (code *)0x113480;
    fdb_get_default_config();
    pcStackY_10f8 = (code *)0x11348d;
    fdb_get_default_kvs_config();
    fStackY_1068.compaction_cb_ctx = &uStackY_10b0;
    uStackY_10b0 = 0;
    uStackY_10a8 = 0;
    uStackY_10a0 = 0;
    fStackY_1068.wal_threshold = 0x400;
    fStackY_1068.flags = 1;
    fStackY_1068.compaction_cb = compaction_cb_markers;
    fStackY_1068.compaction_cb_mask = 0x1b;
    pcStackY_10f8 = (code *)0x1134d3;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_10f8 = (code *)0x1134ea;
    fdb_open(&pfStackY_10e8,"./compact_test1",&fStackY_1068);
    pcStackY_10f8 = (code *)0x113501;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10b8,"db1",&fStackY_1080);
    pcStackY_10f8 = (code *)0x113518;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10c0,"db2",&fStackY_1080);
    pcStackY_10f8 = (code *)0x11352f;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10c8,"db3",&fStackY_1080);
    pcStackY_10f8 = (code *)0x113546;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10d0,"db4",&fStackY_1080);
    pcStackY_10f8 = (code *)0x11355d;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10d8,"db5",&fStackY_1080);
    uVar6 = 0;
    do {
      iVar2 = (int)uVar6;
      if (iVar2 == 5) goto LAB_001136e1;
      uVar6 = 0;
      iStackY_10dc = iVar2;
      do {
        pcStackY_10f8 = (code *)0x11359b;
        sprintf(acStackY_e70,"key%04d",uVar6);
        pcStackY_10f8 = (code *)0x1135aa;
        sprintf(acStackY_f70,"body%04d",uVar6);
        pfVar5 = pfStackY_10b8;
        pcStackY_10f8 = (code *)0x1135b7;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x1135c5;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x1135d9;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar5 = pfStackY_10c0;
        pcStackY_10f8 = (code *)0x1135e6;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x1135f1;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x113605;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar5 = pfStackY_10c8;
        pcStackY_10f8 = (code *)0x113612;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x11361d;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x113631;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar5 = pfStackY_10d0;
        pcStackY_10f8 = (code *)0x11363e;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x113649;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x11365d;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar13 = pfStackY_10d8;
        pcStackY_10f8 = (code *)0x11366a;
        pfVar5 = (fdb_kvs_handle *)strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x113675;
        sVar3 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x113693;
        fdb_set_kv(pfVar13,acStackY_e70,(size_t)pfVar5,acStackY_f70,sVar3);
        uVar9 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar9;
      } while (uVar9 != 1000);
      pcStackY_10f8 = (code *)0x1136b0;
      pfVar11 = pfStackY_10e8;
      fVar1 = fdb_commit(pfStackY_10e8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_10f8 = (code *)0x113740;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_00113740;
      }
      uVar6 = (ulong)(iStackY_10dc + 1U);
      uStackY_10b0 = CONCAT44(uStackY_10b0._4_4_,(iStackY_10dc + 1U) * 1000);
      pcStackY_10f8 = (code *)0x1136d4;
      fVar1 = fdb_compact(pfStackY_10e8,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_10f8 = (code *)0x1136e1;
    compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
    pcStackY_10f8 = (code *)0x1136eb;
    pfVar11 = pfStackY_10e8;
    fVar1 = fdb_close(pfStackY_10e8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_10f8 = (code *)0x1136f4;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar17 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pcStackY_10f8 = (code *)0x113729;
        fprintf(_stderr,pcVar17,"compact with snapshot_open multi kvs test");
        return;
      }
    }
    else {
LAB_00113740:
      pcStackY_10f8 = (code *)0x113745;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_10f8 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_1100 = "body%04d";
    pcStackY_1120 = "key%04d";
    pcStackY_1170 = (code *)0x11376f;
    pcStackY_1118 = acStackY_f70;
    pfStackY_1110 = pfVar5;
    pcStackY_1108 = acStackY_e70;
    pcStackY_10f8 = (code *)uVar6;
    gettimeofday(&tStackY_1130,(__timezone_ptr_t)0x0);
    pcStackY_1170 = (code *)0x113779;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_10e8->root;
    pcStackY_1170 = (code *)0x11378c;
    fVar1 = fdb_get_all_snap_markers(pfVar11,(fdb_snapshot_info_t **)&pfStackY_1168,&uStackY_1158);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfVar5 = pfStackY_1168;
      if ((pfStackY_1168->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
        pcStackY_1170 = (code *)0x113870;
        compaction_cb_markers();
        pfVar5 = pfStackY_1160;
      }
      if (*(fdb_seqnum_t *)((long)(pfVar5->kvs_config).custom_cmp_param + 8) == (long)iVar2) {
        if (uStackY_1158 != 0) {
          uVar10 = 0;
          uVar6 = uStackY_1158;
          do {
            if ((&pfVar5->kvs_config)[uVar10].custom_cmp != (fdb_custom_cmp_variable)0x0) {
              lVar15 = 0;
              p_Var16 = (fdb_custom_cmp_variable)0x0;
              do {
                pcVar17 = *(char **)((long)(&pfVar5->kvs_config)[uVar10].custom_cmp_param + lVar15);
                if (pcVar17 != (char *)0x0) {
                  pcStackY_1170 = (code *)0x1137fa;
                  fdb_kvs_open(pfVar11,&pfStackY_1160,pcVar17,&fStackY_1148);
                  pcStackY_1170 = (code *)0x11380c;
                  fVar1 = fdb_snapshot_open(pfStackY_1160,&pfStackY_1150,(long)iVar2);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_1170 = (code *)0x11381a;
                    fVar1 = fdb_kvs_close(pfStackY_1150);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_1170 = (code *)0x11387d;
                      compaction_cb_markers();
                      goto LAB_0011387d;
                    }
                    pcStackY_1170 = (code *)0x113828;
                    fVar1 = fdb_kvs_close(pfStackY_1160);
                    pfVar5 = pfStackY_1168;
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                  }
                  else {
LAB_0011387d:
                    pcStackY_1170 = (code *)0x113882;
                    compaction_cb_markers();
                  }
                  pcStackY_1170 = (code *)0x113887;
                  compaction_cb_markers();
                  goto LAB_00113887;
                }
LAB_00113830:
                p_Var16 = p_Var16 + 1;
                lVar15 = lVar15 + 0x10;
                uVar6 = uStackY_1158;
              } while (p_Var16 < (&pfVar5->kvs_config)[uVar10].custom_cmp);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar6);
        }
        return;
      }
    }
    else {
LAB_00113887:
      pcStackY_1170 = (code *)0x11388c;
      compaction_cb_markers();
    }
    pcStackY_1170 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_1278,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_1268.compaction_cb = cb_cancel_test;
    fStackY_1268.compaction_cb_ctx = (void *)0x0;
    fStackY_1268.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_1280,"compact_test",&fStackY_1268);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_1280,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_1280);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pbStackY_960 = (btree *)0x112ba2;
  fVar1 = fdb_kvs_open(pfStack_930,&pfStack_928,"db",&fStack_8f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113181;
  pfVar5 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)pfVar5 >> 8),iStack_93c == 0);
  pcStack_920 = pcVar17 + 0x1a;
  unaff_R13 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
  pcVar8 = auStack_7c8;
  fconfig_00 = (fdb_config *)0x0;
  do {
    uVar9 = (uint)fconfig_00;
    pfVar7 = (fdb_config *)(ulong)(uVar9 - 5);
    if (uVar9 < 5) {
      pfVar7 = fconfig_00;
    }
    pbStackY_960 = (btree *)0x112bea;
    sprintf((char *)unaff_R13,"key%06d",pfVar7);
    builtin_strncpy(pcVar17,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_920,"<end>",6);
    pfVar7 = (fdb_config *)(ulong)(uVar9 - 5);
    if (uVar9 < 5) {
      pcVar18 = "value%08d";
      pfVar7 = fconfig_00;
    }
    else {
      pcVar18 = "updated_value%08d";
    }
    pbStackY_960 = (btree *)0x112c2e;
    sprintf(pcVar17,pcVar18,pfVar7);
    pfVar13 = pfStack_928;
    pbStackY_960 = (btree *)0x112c3b;
    sVar3 = strlen((char *)unaff_R13);
    pbStackY_960 = (btree *)0x112c53;
    fVar1 = fdb_set_kv(pfVar13,unaff_R13,sVar3 + 1,pcVar17,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113134;
    pfVar7 = fconfig_00;
    if (iStack_93c == 3) {
LAB_00112c74:
      pfVar5 = (fdb_kvs_handle *)((ulong)pfVar7 & 0xffffffffffffff01);
    }
    else if (iStack_93c == 2) {
      pfVar7 = (fdb_config *)CONCAT71((int7)((ulong)fconfig_00 >> 8),~(byte)fconfig_00);
      goto LAB_00112c74;
    }
    pbStackY_960 = (btree *)0x112c86;
    fVar1 = fdb_commit(pfStack_930,(fdb_commit_opt_t)pfVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113139;
    pbStackY_960 = (btree *)0x112c9b;
    fVar1 = fdb_get_kvs_info(pfStack_928,(fdb_kvs_info *)pcVar8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011313e;
    fconfig_00 = (fdb_config *)(ulong)(uVar9 + 1);
  } while (uVar9 + 1 != 10);
  pbStackY_960 = (btree *)0x112cc2;
  fVar1 = fdb_get_all_snap_markers(pfStack_930,&pfStack_910,(uint64_t *)&iStack_918);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113186;
  fconfig_00 = (fdb_config *)(CONCAT44(uStack_914,iStack_918) >> 1);
  pbStackY_960 = (btree *)0x112cf3;
  fVar1 = fdb_compact_upto(pfStack_930,"./compact_test2",pfStack_910[(int)fconfig_00].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011318b;
  if (-1 < (int)(iStack_918 - 1U)) {
    pfVar5 = (fdb_kvs_handle *)(ulong)(iStack_918 - 1U);
    lStack_8f8 = (long)(int)fconfig_00;
    fconfig_00 = (fdb_config *)(auStack_7c8 + 0x30);
    do {
      pfVar13 = (fdb_kvs_handle *)(pfStack_910[(long)pfVar5].kvs_markers)->seqnum;
      pbStackY_960 = (btree *)0x112d3e;
      fVar1 = fdb_snapshot_open(pfStack_928,&pfStack_908,(fdb_seqnum_t)pfVar13);
      if (lStack_8f8 < (long)pfVar5) {
        pfVar14 = pfVar5;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011315e;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113163;
        pbStackY_960 = (btree *)0x112d7f;
        pfStack_900 = pfVar5;
        fVar1 = fdb_iterator_init(pfStack_908,&pfStack_948,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113168;
        pfVar13 = (fdb_kvs_handle *)((long)&pfVar13[-1].bub_ctx.handle + 3);
        pfVar5 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_938 = (fdb_kvs_handle *)0x0;
          pbStackY_960 = (btree *)0x112da6;
          fVar1 = fdb_iterator_get(pfStack_948,(fdb_doc **)&pfStack_938);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pbStackY_960 = (btree *)0x112dc2;
          sprintf((char *)fconfig_00,"key%06d",(ulong)pfVar5 & 0xffffffff);
          builtin_strncpy(pcVar17,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
          builtin_strncpy(pcStack_920,"<end>",6);
          pcVar8 = "value%08d";
          if (pfVar5 < pfVar13) {
            pcVar8 = "updated_value%08d";
          }
          pbStackY_960 = (btree *)0x112e05;
          sprintf(pcVar17,pcVar8,(ulong)pfVar5 & 0xffffffff);
          unaff_R13 = pfStack_938;
          pcVar8 = (char *)pfStack_938->op_stats;
          pbStackY_960 = (btree *)0x112e1d;
          iVar2 = bcmp(pcVar8,fconfig_00,*(size_t *)&pfStack_938->kvs_config);
          if (iVar2 != 0) {
            pbStackY_960 = (btree *)0x113129;
            compact_upto_overwrite_test();
LAB_00113129:
            pbStackY_960 = (btree *)0x113134;
            compact_upto_overwrite_test();
            goto LAB_00113134;
          }
          pcVar8 = (char *)(unaff_R13->field_6).seqtree;
          pbStackY_960 = (btree *)0x112e38;
          iVar2 = bcmp(pcVar8,pcVar17,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113129;
          pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
          pbStackY_960 = (btree *)0x112e4b;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pbStackY_960 = (btree *)0x112e55;
          fVar1 = fdb_iterator_next(pfStack_948);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pbStackY_960 = (btree *)0x112e67;
        fVar1 = fdb_iterator_close(pfStack_948);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011316d;
        if ((int)pfVar5 != 5) goto LAB_00113177;
        pbStackY_960 = (btree *)0x112e83;
        fVar1 = fdb_kvs_close(pfStack_908);
        pfVar5 = pfStack_900;
        pfVar14 = pfStack_900;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113172;
      }
      pfVar5 = (fdb_kvs_handle *)((long)&pfVar14[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar14);
  }
  pbStackY_960 = (btree *)0x112ec1;
  fVar1 = fdb_iterator_init(pfStack_928,&pfStack_948,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113190;
  unaff_R13 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
  pcVar8 = "updated_value%08d";
  fconfig_00 = (fdb_config *)0x0;
  do {
    pfStack_938 = (fdb_kvs_handle *)0x0;
    pbStackY_960 = (btree *)0x112ef2;
    fVar1 = fdb_iterator_get(pfStack_948,(fdb_doc **)&pfStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pbStackY_960 = (btree *)0x112f0d;
    sprintf((char *)unaff_R13,"key%06d",fconfig_00);
    builtin_strncpy(pcVar17,"xxxxxxxxxxxxxxxxxxxxxxxxxx",0x1a);
    builtin_strncpy(pcStack_920,"<end>",6);
    pbStackY_960 = (btree *)0x112f3d;
    sprintf(pcVar17,"updated_value%08d",fconfig_00);
    pfVar13 = pfStack_938;
    pfVar5 = (fdb_kvs_handle *)pfStack_938->op_stats;
    pbStackY_960 = (btree *)0x112f54;
    iVar2 = bcmp(pfVar5,unaff_R13,*(size_t *)&pfStack_938->kvs_config);
    if (iVar2 != 0) goto LAB_00113143;
    pfVar5 = (fdb_kvs_handle *)(pfVar13->field_6).seqtree;
    pbStackY_960 = (btree *)0x112f6f;
    iVar2 = bcmp(pfVar5,pcVar17,(size_t)(pfVar13->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_00113153;
    fconfig_00 = (fdb_config *)(ulong)((int)fconfig_00 + 1);
    pbStackY_960 = (btree *)0x112f81;
    fdb_doc_free((fdb_doc *)pfVar13);
    pbStackY_960 = (btree *)0x112f8b;
    fVar1 = fdb_iterator_next(pfStack_948);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pbStackY_960 = (btree *)0x112f9d;
  fVar1 = fdb_iterator_close(pfStack_948);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113195;
  if ((int)fconfig_00 != 5) goto LAB_0011319a;
  pbStackY_960 = (btree *)0x112fbd;
  fVar1 = fdb_free_snap_markers(pfStack_910,CONCAT44(uStack_914,iStack_918));
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011319f;
  pbStackY_960 = (btree *)0x112fcd;
  free(pcVar17);
  pbStackY_960 = (btree *)0x112fd7;
  fVar1 = fdb_close(pfStack_930);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a4;
  pbStackY_960 = (btree *)0x112fe4;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001131a9;
  pbStackY_960 = (btree *)0x112ff1;
  memleak_end();
  builtin_strncpy(acStack_8d8 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_8d8,"compact upto ove",0x10);
  switch(iStack_93c) {
  case 0:
    pbStackY_960 = (btree *)0x11303b;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pbStackY_960 = (btree *)0x1130bf;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3," (WAL)",7);
    break;
  case 2:
    pbStackY_960 = (btree *)0x113067;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3 + 0xe,"ie/WAL)",8);
    uVar19._0_1_ = ' ';
    uVar19._1_1_ = 'H';
    uVar19._2_1_ = 'B';
    uVar19._3_1_ = '+';
    uVar20._0_1_ = 't';
    uVar20._1_1_ = 'r';
    uVar20._2_1_ = 'i';
    uVar20._3_1_ = 'e';
    goto LAB_001130a8;
  case 3:
    pbStackY_960 = (btree *)0x11308f;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3 + 0xe,"B+trie)",8);
    uVar19._0_1_ = ' ';
    uVar19._1_1_ = 'W';
    uVar19._2_1_ = 'A';
    uVar19._3_1_ = 'L';
    uVar20._0_1_ = '/';
    uVar20._1_1_ = 'H';
    uVar20._2_1_ = 'B';
    uVar20._3_1_ = '+';
LAB_001130a8:
    pcVar17 = acStack_8d8 + sVar3;
    pcVar17[0] = ' ';
    pcVar17[1] = '(';
    pcVar17[2] = 'm';
    pcVar17[3] = 'i';
    pcVar17 = acStack_8d8 + sVar3 + 4;
    pcVar17[0] = 'x';
    pcVar17[1] = 'e';
    pcVar17[2] = 'd';
    pcVar17[3] = ',';
    *(undefined4 *)(acStack_8d8 + sVar3 + 8) = uVar19;
    *(undefined4 *)(acStack_8d8 + sVar3 + 0xc) = uVar20;
  }
  pcVar17 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar17 = "%s FAILED\n";
  }
  pbStackY_960 = (btree *)0x113107;
  fprintf(_stderr,pcVar17,acStack_8d8);
  return;
}

Assistant:

void wal_delete_compact_upto_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    uint64_t num_markers;
    fdb_kvs_info kvs_info;
    char keybuf[256];
    void *value;
    size_t valuelen;

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 19;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // open db
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // insert a few keys...
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert keys such that last insert causes wal flush...
    for (; i<20;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now delete half of the newly inserted keys
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now deleted items are in the unflushed wal..
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another header for compact_upto()
    sprintf(keybuf, "key%d", i);
    status = fdb_set_kv(db, keybuf, strlen(keybuf),
            (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Get all snap markers..
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // compact upto the delete wal's marker...
    status = fdb_compact_upto(dbfile, NULL, markers[1].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Deleted items should not be found..
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto with wal deletes test");
}